

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O0

char * sigfig(double val,int figs,char *buf,int len)

{
  int in_EDX;
  char *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  int digitsAfterDecimal;
  char format [80];
  char local_78 [92];
  int local_1c;
  char *local_18;
  double local_8;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_8 = in_XMM0_Qa;
  dVar1 = log10(ABS(in_XMM0_Qa));
  dVar1 = ceil(dVar1);
  if (in_EDI - (int)dVar1 < 1) {
    snprintf(local_78,0x50,"%%.0f");
  }
  else {
    snprintf(local_78,0x50,"%%.%df",(ulong)(uint)(in_EDI - (int)dVar1));
  }
  snprintf(local_18,(long)local_1c,local_78,local_8);
  return local_18;
}

Assistant:

static char *sigfig(double val, int figs, char *buf, int len)
{
  char format[80];
  int digitsAfterDecimal = figs - (int)ceil(log10(fabs(val)));

  if (digitsAfterDecimal < 1)
    snprintf(format, 80, "%%.0f");
  else
    snprintf(format, 80, "%%.%df", digitsAfterDecimal);
  snprintf(buf, len, format, val);
  return buf;
}